

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall tcu::shearMatrix(tcu *this,Vector<float,_2> *shear)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  Vector<float,_2> VVar4;
  Matrix<float,_2,_2> MVar5;
  Vector<float,_2> *shear_local;
  Matrix<float,_2,_2> *mat;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,0,0);
  *pfVar1 = 1.0;
  fVar2 = Vector<float,_2>::x(shear);
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,0,1);
  *pfVar1 = fVar2;
  fVar2 = Vector<float,_2>::y(shear);
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,1,0);
  *pfVar1 = fVar2;
  fVar2 = Vector<float,_2>::x(shear);
  fVar3 = Vector<float,_2>::y(shear);
  VVar4.m_data[0] = 1.0;
  VVar4.m_data[1] = 0.0;
  MVar5.m_data.m_data[0].m_data[0] = fVar2 * fVar3 + 1.0;
  pfVar1 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,1,1);
  MVar5.m_data.m_data[0].m_data[1] = 0.0;
  *pfVar1 = MVar5.m_data.m_data[0].m_data[0];
  MVar5.m_data.m_data[1].m_data[0] = VVar4.m_data[0];
  MVar5.m_data.m_data[1].m_data[1] = VVar4.m_data[1];
  return (Matrix<float,_2,_2>)MVar5.m_data.m_data;
}

Assistant:

inline Matrix<float, 2, 2> shearMatrix (const Vector<float, 2>& shear)
{
	Matrix<float, 2, 2> mat;
	mat(0, 0) = 1.0f;
	mat(0, 1) = shear.x();
	mat(1, 0) = shear.y();
	mat(1, 1) = 1.0f + shear.x()*shear.y();
	return mat;
}